

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O2

void xdgDecorationHandleConfigure
               (void *userData,zxdg_toplevel_decoration_v1 *decoration,uint32_t mode)

{
  wl_buffer *buffer;
  _GLFWwindow *window;
  uchar auStack_34 [4];
  GLFWimage GStack_30;
  
  *(uint32_t *)((long)userData + 0x3d0) = mode;
  if (mode != 1) {
    *(undefined4 *)((long)userData + 0x460) = 0;
    destroyFallbackEdge((_GLFWfallbackEdgeWayland *)((long)userData + 0x470));
    destroyFallbackEdge((_GLFWfallbackEdgeWayland *)((long)userData + 0x488));
    destroyFallbackEdge((_GLFWfallbackEdgeWayland *)((long)userData + 0x4a0));
    destroyFallbackEdge((_GLFWfallbackEdgeWayland *)((long)userData + 0x4b8));
    return;
  }
  if ((*(int *)((long)userData + 0xc) != 0) && (*(long *)((long)userData + 0x50) == 0)) {
    GStack_30.pixels = auStack_34;
    auStack_34[0] = 0xe0;
    auStack_34[1] = 0xe0;
    auStack_34[2] = 0xe0;
    auStack_34[3] = 0xff;
    GStack_30.width = 1;
    GStack_30.height = 1;
    if (_glfw.wl.viewporter != (wp_viewporter *)0x0) {
      buffer = *(wl_buffer **)((long)userData + 0x468);
      if (buffer == (wl_buffer *)0x0) {
        buffer = createShmBuffer(&GStack_30);
        *(wl_buffer **)((long)userData + 0x468) = buffer;
        if (buffer == (wl_buffer *)0x0) {
          return;
        }
      }
      createFallbackEdge((_GLFWwindow *)userData,
                         (_GLFWfallbackEdgeWayland *)((long)userData + 0x470),
                         *(wl_surface **)((long)userData + 0x388),buffer,0,-0x18,
                         *(int *)((long)userData + 0x358),0x18);
      createFallbackEdge((_GLFWwindow *)userData,
                         (_GLFWfallbackEdgeWayland *)((long)userData + 0x488),
                         *(wl_surface **)((long)userData + 0x388),
                         *(wl_buffer **)((long)userData + 0x468),-4,-0x18,4,
                         *(int *)((long)userData + 0x35c) + 0x18);
      createFallbackEdge((_GLFWwindow *)userData,
                         (_GLFWfallbackEdgeWayland *)((long)userData + 0x4a0),
                         *(wl_surface **)((long)userData + 0x388),
                         *(wl_buffer **)((long)userData + 0x468),*(int *)((long)userData + 0x358),
                         -0x18,4,*(int *)((long)userData + 0x35c) + 0x18);
      createFallbackEdge((_GLFWwindow *)userData,
                         (_GLFWfallbackEdgeWayland *)((long)userData + 0x4b8),
                         *(wl_surface **)((long)userData + 0x388),
                         *(wl_buffer **)((long)userData + 0x468),-4,*(int *)((long)userData + 0x35c)
                         ,*(int *)((long)userData + 0x358) + 8,4);
      *(undefined4 *)((long)userData + 0x460) = 1;
    }
    return;
  }
  return;
}

Assistant:

static void xdgDecorationHandleConfigure(void* userData,
                                         struct zxdg_toplevel_decoration_v1* decoration,
                                         uint32_t mode)
{
    _GLFWwindow* window = userData;

    window->wl.xdg.decorationMode = mode;

    if (mode == ZXDG_TOPLEVEL_DECORATION_V1_MODE_CLIENT_SIDE)
    {
        if (window->decorated && !window->monitor)
            createFallbackDecorations(window);
    }
    else
        destroyFallbackDecorations(window);
}